

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O3

int AF_A_MinotaurChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  PClass *pPVar7;
  AActor *self;
  VMValue *pVVar8;
  FState *newstate;
  char *__assertion;
  FString *this;
  long lVar9;
  bool bVar10;
  bool bVar11;
  VMValue params [3];
  FSoundID local_78;
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  undefined4 extraout_var_00;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ef64a;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005ef63a;
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005ef323;
    pPVar6 = (self->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (self->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar10 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar6 == pPVar7;
    if (!bVar11 && !bVar10) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar7) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar5 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005ef64a;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005ef63a;
LAB_005ef323:
    self = (AActor *)0x0;
    pVVar8 = param;
    uVar5 = numparam;
  }
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005ef3ea;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005ef63a:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005ef64a;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar6 = (PClass *)puVar2[1];
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
          puVar2[1] = pPVar6;
        }
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar7 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar7) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ef64a;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005ef63a;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ef3ea:
    pPVar6 = AMinotaurFriend::RegistrationInfo.MyClass;
    pPVar7 = (self->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar7 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (self->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar10 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar6 && bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar6) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar10) {
      A_Chase(stack,self);
      return 0;
    }
    self->RenderStyle = LegacyRenderStyles[1];
    if ((-1 < *(int *)&self->field_0x49c) && (0x36a < level.maptime - *(int *)&self->field_0x49c)) {
      local_74.Index = 0;
      local_70.Degrees = 0.0;
      P_DamageMobj(self,(AActor *)0x0,(AActor *)0x0,1000000,&local_74,0,&local_70);
      return 0;
    }
    uVar5 = FRandom::GenRand32(&pr_minotaurchase);
    if ((uVar5 & 0xfe) < 0x1e) {
      local_68.field_1.atag = 1;
      local_68.field_3.Type = '\x03';
      local_50 = 1;
      local_4c = 3;
      local_48.Chars = (char *)0x0;
      local_40 = 8;
      local_3c[0] = 3;
      local_68._0_8_ = self;
      local_58 = self;
      VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,(VMValue *)&local_68.field_1,
                         3,(VMReturn *)0x0,0,(VMException **)0x0);
      lVar9 = -0x30;
      this = &local_48;
      do {
        if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
          FString::~FString(this);
        }
        this = this + -2;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0);
    }
    pAVar3 = (self->target).field_0.p;
    if (pAVar3 != (AActor *)0x0) {
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if ((0 < pAVar3->health) && (((pAVar3->flags).Value & 4) != 0)) {
          FaceMovementDirection(self);
          self->reactiontime = 0;
          if ((self->MeleeState == (FState *)0x0) ||
             (bVar10 = AActor::CheckMeleeRange(self), !bVar10)) {
            if ((self->MissileState == (FState *)0x0) ||
               (bVar10 = P_CheckMissileRange(self), !bVar10)) {
              bVar10 = P_Move(self);
              if (!bVar10) {
                P_NewChaseDir(self);
                FaceMovementDirection(self);
              }
              uVar5 = FRandom::GenRand32(&pr_minotaurchase);
              if (5 < (uVar5 & 0xfe)) {
                return 0;
              }
              AActor::PlayActiveSound(self);
              return 0;
            }
            newstate = self->MissileState;
          }
          else {
            iVar4 = (self->AttackSound).super_FSoundID.ID;
            if (iVar4 != 0) {
              local_78.ID = iVar4;
              S_Sound(self,1,&local_78,1.0,1.0);
            }
            newstate = self->MeleeState;
          }
          AActor::SetState(self,newstate,false);
          return 0;
        }
      }
      else {
        (self->target).field_0.p = (AActor *)0x0;
      }
    }
    AActor::SetIdle(self,false);
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005ef64a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurChase)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		A_Chase (stack, self);
		return 0;
	}

	AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

	// In case pain caused him to skip his fade in.
	self1->RenderStyle = STYLE_Normal;

	if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
	{
		P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
		return 0;
	}

	if (pr_minotaurchase() < 30)
		CALL_ACTION(A_MinotaurLook, self1);		// adjust to closest target

	if (!self1->target || (self1->target->health <= 0) ||
		!(self1->target->flags&MF_SHOOTABLE))
	{ // look for a new target
		self1->SetIdle();
		return 0;
	}

	FaceMovementDirection (self1);
	self1->reactiontime = 0;

	// Melee attack
	if (self1->MeleeState && self1->CheckMeleeRange ())
	{
		if (self1->AttackSound)
		{
			S_Sound (self1, CHAN_WEAPON, self1->AttackSound, 1, ATTN_NORM);
		}
		self1->SetState (self1->MeleeState);
		return 0;
	}

	// Missile attack
	if (self1->MissileState && P_CheckMissileRange(self1))
	{
		self1->SetState (self1->MissileState);
		return 0;
	}

	// chase towards target
	if (!P_Move (self1))
	{
		P_NewChaseDir (self1);
		FaceMovementDirection (self1);
	}

	// Active sound
	if (pr_minotaurchase() < 6)
	{
		self1->PlayActiveSound ();
	}
	return 0;
}